

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hr.cc
# Opt level: O0

size_t __thiscall OB::Hr::term_width(Hr *this,bool is_term)

{
  Hr *local_28;
  size_t width;
  Hr *pHStack_18;
  bool is_term_local;
  Hr *this_local;
  
  if (this->width_ == 0) {
    if (is_term) {
      local_28 = (Hr *)0x0;
      width._7_1_ = is_term;
      pHStack_18 = this;
      Term::width((size_t *)&local_28,1);
      this_local = local_28;
    }
    else {
      this_local = (Hr *)this->width_default_;
    }
  }
  else {
    this_local = (Hr *)this->width_;
  }
  return (size_t)this_local;
}

Assistant:

std::size_t Hr::term_width(bool const is_term) const
{
  if (width_ > 0)
  {
    return width_;
  }

  if (is_term)
  {
    std::size_t width {0};
    OB::Term::width(width);

    return width;
  }

  return width_default_;
}